

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O0

void __thiscall ncnn::MultiHeadAttention::MultiHeadAttention(MultiHeadAttention *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffffb0;
  
  Layer::Layer(in_stack_ffffffffffffffb0);
  *in_RDI = &PTR__MultiHeadAttention_009b8648;
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x1c));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x25));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x2e));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x37));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x40));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x49));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x52));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x5b));
  return;
}

Assistant:

MultiHeadAttention::MultiHeadAttention()
{
}